

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::InvalidateDataTest::CheckErrorAndLog
          (InvalidateDataTest *this,GLenum *attachments,GLuint count)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  string attachments_names;
  Enum<int,_2UL> local_1e0;
  string local_1d0 [32];
  undefined1 local_1b0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d0,glcts::fixed_sample_locations_values + 1,(allocator<char> *)local_1b0);
    for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
      local_1e0.m_value = attachments[uVar2];
      local_1e0.m_getName = glu::getFramebufferAttachmentName;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)local_1b0,&local_1e0);
      std::__cxx11::string::append(local_1d0);
      std::__cxx11::string::~string((string *)local_1b0);
      if (count - 1 != uVar2) {
        std::__cxx11::string::append((char *)local_1d0);
      }
    }
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"InvalidateDataTest unexpectedly generated ");
    local_1e0.m_getName = glu::getErrorName;
    local_1e0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," error for following attachments [");
    std::operator<<((ostream *)this_00,local_1d0);
    std::operator<<((ostream *)this_00,"]. Test fails.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::__cxx11::string::~string(local_1d0);
  }
  return iVar1 == 0;
}

Assistant:

bool InvalidateDataTest::CheckErrorAndLog(const glw::GLenum attachments[], glw::GLuint count)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check error. */
	if (glw::GLenum error = gl.getError())
	{
		/* There is an error. Log. */
		std::string attachments_names = "";

		for (glw::GLuint i = 0; i < count; ++i)
		{
			attachments_names.append(glu::getFramebufferAttachmentStr(attachments[i]).toString());

			if ((count - 1) != i)
			{
				attachments_names.append(", ");
			}
		}

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "InvalidateDataTest unexpectedly generated "
											<< glu::getErrorStr(error) << " error for following attachments ["
											<< attachments_names << "]. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}